

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void parse_loop(Parser *psr)

{
  int target_idx;
  BcIns ins;
  int jmp_idx_00;
  Function *pFVar1;
  int jmp_idx;
  int start;
  Parser *psr_local;
  
  lex_next(&psr->lxr);
  pFVar1 = psr_fn(psr);
  target_idx = pFVar1->ins_count;
  lex_expect(&psr->lxr,0x7b);
  lex_next(&psr->lxr);
  parse_block(psr);
  lex_expect(&psr->lxr,0x7d);
  lex_next(&psr->lxr);
  pFVar1 = psr_fn(psr);
  ins = bc_new1(BC_LOOP,0);
  jmp_idx_00 = fn_emit(pFVar1,ins);
  jmp_set_target(psr,jmp_idx_00,target_idx);
  return;
}

Assistant:

static void parse_loop(Parser *psr) {
	// Skip the `loop` token
	lex_next(&psr->lxr);

	// Save the start of the loop
	int start = psr_fn(psr)->ins_count;

	// Parse the contents of the loop
	lex_expect(&psr->lxr, '{');
	lex_next(&psr->lxr);
	parse_block(psr);
	lex_expect(&psr->lxr, '}');
	lex_next(&psr->lxr);

	// Add a jump back to the start
	int jmp_idx = fn_emit(psr_fn(psr), bc_new1(BC_LOOP, 0));
	jmp_set_target(psr, jmp_idx, start);
}